

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tcuVector.hpp
# Opt level: O3

void deqp::gles3::Functional::eval_bitwiseXorVecScalar_ivec4(ShaderEvalContext *c)

{
  float fVar1;
  float fVar2;
  float fVar3;
  uint uVar4;
  
  fVar1 = c->in[0].m_data[0];
  fVar2 = c->in[0].m_data[2];
  fVar3 = c->in[0].m_data[3];
  uVar4 = (uint)c->in[1].m_data[0];
  (c->color).m_data[0] = (float)(int)(uVar4 ^ (int)c->in[0].m_data[1]);
  (c->color).m_data[1] = (float)(int)(uVar4 ^ (int)fVar2);
  (c->color).m_data[2] = (float)(int)(uVar4 ^ (int)fVar3);
  (c->color).m_data[3] = (float)(int)(uVar4 ^ (int)fVar1);
  return;
}

Assistant:

Vector<T, 4>			swizzle		(int a, int b, int c, int d) const { DE_ASSERT(a >= 0 && a < Size); DE_ASSERT(b >= 0 && b < Size); DE_ASSERT(c >= 0 && c < Size); DE_ASSERT(d >= 0 && d < Size); return Vector<T, 4>(m_data[a], m_data[b], m_data[c], m_data[d]); }